

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

pointer __thiscall
google::protobuf::RepeatedField<double>::Mutable(RepeatedField<double> *this,int index)

{
  int iVar1;
  double *pdVar2;
  string *psVar3;
  void *ptr;
  RepeatedField<double> *this_00;
  long lVar4;
  Arena *this_01;
  Arena *pAStack_40;
  long lStack_38;
  RepeatedField<double> *pRStack_30;
  Arena aAStack_28 [16];
  
  this_01 = aAStack_28;
  lVar4 = (long)index;
  if (index < 0) {
    pRStack_30 = (RepeatedField<double> *)0x146f5a;
    psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>(lVar4,0,"index >= 0");
  }
  else {
    psVar3 = (string *)0x0;
  }
  if (psVar3 == (string *)0x0) {
    pRStack_30 = (RepeatedField<double> *)0x146f1f;
    iVar1 = internal::SooRep::size
                      (&this->soo_rep_,
                       (undefined1  [16])
                       ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                       (undefined1  [16])0x0);
    if (index < iVar1) {
      psVar3 = (string *)0x0;
    }
    else {
      pRStack_30 = (RepeatedField<double> *)0x146f6e;
      psVar3 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         (lVar4,(long)iVar1,"index < size()");
    }
    if (psVar3 == (string *)0x0) {
      pRStack_30 = (RepeatedField<double> *)0x146f3c;
      pdVar2 = elements(this,(undefined1  [16])
                             ((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
                             (undefined1  [16])0x0);
      return pdVar2 + lVar4;
    }
  }
  else {
    pRStack_30 = (RepeatedField<double> *)0x146f7b;
    Mutable();
  }
  pRStack_30 = (RepeatedField<double> *)
               Arena::CreateArenaCompatible<google::protobuf::RepeatedField<double>>;
  Mutable();
  lStack_38 = lVar4;
  pRStack_30 = this;
  if (this_01 == (Arena *)0x0) {
    this_00 = (RepeatedField<double> *)operator_new(0x10);
    RepeatedField(this_00,(Arena *)0x0);
  }
  else {
    ptr = Arena::Allocate(this_01,0x10);
    pAStack_40 = this_01;
    this_00 = Arena::InternalHelper<google::protobuf::RepeatedField<double>>::
              Construct<google::protobuf::Arena*>(ptr,&pAStack_40);
  }
  return (pointer)this_00;
}

Assistant:

inline Element* RepeatedField<Element>::Mutable(int index)
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  ABSL_DCHECK_GE(index, 0);
  ABSL_DCHECK_LT(index, size());
  return &elements(is_soo())[index];
}